

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O3

void __thiscall flatbuffers::BinaryAnnotator::~BinaryAnnotator(BinaryAnnotator *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_flatbuffers::BinarySection>,_std::_Select1st<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  ::~_Rb_tree(&(this->sections_)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>_>
  ::~_Rb_tree(&(this->vtables_)._M_t);
  pcVar1 = (this->root_table_)._M_dataplus._M_p;
  paVar2 = &(this->root_table_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

explicit BinaryAnnotator(const uint8_t *const bfbs,
                           const uint64_t bfbs_length,
                           const uint8_t *const binary,
                           const uint64_t binary_length,
                           const bool is_size_prefixed)
      : bfbs_(bfbs),
        bfbs_length_(bfbs_length),
        schema_(reflection::GetSchema(bfbs)),
        root_table_(""),
        binary_(binary),
        binary_length_(binary_length),
        is_size_prefixed_(is_size_prefixed) {}